

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  LogicalType *in_stack_ffffffffffffff40;
  string local_b8;
  undefined1 local_98 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_48;
  
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  ::std::__cxx11::string::string((string *)&local_48,(string *)msg);
  ::std::__cxx11::string::string((string *)&local_68,(string *)params);
  LogicalType::LogicalType((LogicalType *)local_98,(LogicalType *)params_1);
  LogicalType::LogicalType((LogicalType *)(local_98 + 0x18),params_2);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,this,&local_b8,&local_48,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (LogicalType *)(local_98 + 0x18),in_stack_ffffffffffffff40);
  LogicalType::~LogicalType((LogicalType *)(local_98 + 0x18));
  LogicalType::~LogicalType((LogicalType *)local_98);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_b8);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}